

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O3

string * __thiscall ftxui::Screen::ToString_abi_cxx11_(string *__return_storage_ptr__,Screen *this)

{
  pointer pvVar1;
  pointer pPVar2;
  pointer pPVar3;
  string *psVar4;
  int iVar5;
  Pixel *this_00;
  string *input;
  long lVar6;
  bool bVar7;
  Pixel default_pixel;
  stringstream ss;
  Pixel local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  this_00 = &local_1e8;
  Pixel::Pixel(this_00);
  if (0 < this->dimy_) {
    this_00 = &local_1e8;
    lVar6 = 0;
    do {
      if (lVar6 != 0) {
        anon_unknown_0::UpdatePixelStyle(this,(stringstream *)local_1b8,this_00,&local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\r\n",2);
        this_00 = &local_1e8;
      }
      pvVar1 = (this->pixels_).
               super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar2 = pvVar1[lVar6].super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>._M_impl
               .super__Vector_impl_data._M_start;
      pPVar3 = *(pointer *)
                ((long)&pvVar1[lVar6].
                        super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (pPVar2 != pPVar3) {
        bVar7 = false;
        input = &pPVar2->character;
        do {
          if (!bVar7) {
            anon_unknown_0::UpdatePixelStyle
                      (this,(stringstream *)local_1b8,this_00,
                       (Pixel *)(&input[-1].field_2._M_allocated_capacity + 1));
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(input->_M_dataplus)._M_p,input->_M_string_length);
            this_00 = (Pixel *)(&input[-1].field_2._M_allocated_capacity + 1);
          }
          iVar5 = string_width(input);
          bVar7 = iVar5 == 2;
          psVar4 = input + 1;
          input = (string *)&input[1].field_2;
        } while ((pointer)&psVar4->_M_string_length != pPVar3);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->dimy_);
  }
  anon_unknown_0::UpdatePixelStyle(this,(stringstream *)local_1b8,this_00,&local_1e8);
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.character._M_dataplus._M_p != &local_1e8.character.field_2) {
    operator_delete(local_1e8.character._M_dataplus._M_p,
                    local_1e8.character.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Screen::ToString() const {
  std::stringstream ss;

  const Pixel default_pixel;
  const Pixel* previous_pixel_ref = &default_pixel;

  for (int y = 0; y < dimy_; ++y) {
    // New line in between two lines.
    if (y != 0) {
      UpdatePixelStyle(this, ss, *previous_pixel_ref, default_pixel);
      previous_pixel_ref = &default_pixel;
      ss << "\r\n";
    }

    // After printing a fullwith character, we need to skip the next cell.
    bool previous_fullwidth = false;
    for (const auto& pixel : pixels_[y]) {
      if (!previous_fullwidth) {
        UpdatePixelStyle(this, ss, *previous_pixel_ref, pixel);
        previous_pixel_ref = &pixel;
        ss << pixel.character;
      }
      previous_fullwidth = (string_width(pixel.character) == 2);
    }
  }

  // Reset the style to default:
  UpdatePixelStyle(this, ss, *previous_pixel_ref, default_pixel);

  return ss.str();
}